

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::prune(PtexReader *this)

{
  long *plVar1;
  bool bVar2;
  reference ppLVar3;
  Level *in_RDI;
  iterator i;
  vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
  *in_stack_ffffffffffffffc8;
  Level *in_stack_ffffffffffffffd0;
  __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
  local_10 [2];
  
  if (in_RDI[4].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    plVar1 = in_RDI[4].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    in_RDI[4].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_10[0]._M_current =
       (Level **)
       std::
       vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
       begin(in_stack_ffffffffffffffc8);
  while( true ) {
    std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
    end(in_stack_ffffffffffffffc8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar2) break;
    ppLVar3 = __gnu_cxx::
              __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
              ::operator*(local_10);
    if (*ppLVar3 != (Level *)0x0) {
      ppLVar3 = __gnu_cxx::
                __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
                ::operator*(local_10);
      in_stack_ffffffffffffffd0 = *ppLVar3;
      if (in_stack_ffffffffffffffd0 != (Level *)0x0) {
        Level::~Level(in_RDI);
        operator_delete(in_stack_ffffffffffffffd0,0x48);
      }
      ppLVar3 = __gnu_cxx::
                __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
                ::operator*(local_10);
      *ppLVar3 = (Level *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
    ::operator++(local_10);
  }
  PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::clear
            ((PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>
              *)in_stack_ffffffffffffffd0);
  in_RDI[9].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       in_RDI[9].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  return;
}

Assistant:

void PtexReader::prune()
{
    if (_metadata) { delete _metadata; _metadata = 0; }
    for (std::vector<Level*>::iterator i = _levels.begin(); i != _levels.end(); ++i) {
        if (*i) { delete *i; *i = 0; }
    }
    _reductions.clear();
    _memUsed = _baseMemUsed;
}